

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O1

void __thiscall
libtorrent::find_control_url(libtorrent *this,int type,string_view str,parse_state *state)

{
  pointer *ppbVar1;
  iterator __position;
  pointer pbVar2;
  string_view s1;
  string_view s1_00;
  string_view s1_01;
  bool bVar3;
  parse_state *this_00;
  char *pcVar4;
  string *psVar5;
  undefined4 in_register_00000034;
  int iVar6;
  string_view str1;
  string_view str1_00;
  string_view str1_01;
  string_view s2;
  string_view s2_00;
  string_view s2_01;
  string_view s2_02;
  string_view s2_03;
  string_view str2;
  string_view str2_00;
  string_view str2_01;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_len = CONCAT44(in_register_00000034,type);
  this_00 = (parse_state *)str._M_str;
  local_18._M_str = (char *)str._M_len;
  iVar6 = (int)this;
  if (iVar6 != 4) {
    if (iVar6 == 1) {
      pbVar2 = (this_00->tag_stack).
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this_00->tag_stack).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != pbVar2) {
        if ((this_00->in_service == true) &&
           (s2._M_str = "service", s2._M_len = 7,
           bVar3 = aux::string_equal_no_case(*(string_view *)(pbVar2 + -1),s2), bVar3)) {
          this_00->in_service = false;
        }
        ppbVar1 = &(this_00->tag_stack).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + -1;
      }
    }
    else if (iVar6 == 0) {
      __position._M_current =
           (this_00->tag_stack).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this_00->tag_stack).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)&this_00->tag_stack,__position,&local_18);
      }
      else {
        (__position._M_current)->_M_len = local_18._M_len;
        (__position._M_current)->_M_str = local_18._M_str;
        ppbVar1 = &(this_00->tag_stack).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
    }
    return;
  }
  if ((this_00->tag_stack).
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this_00->tag_stack).
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  if (((this_00->in_service != false) ||
      (str1._M_str = "service", str1._M_len = 7, str2._M_str = "servicetype", str2._M_len = 0xb,
      bVar3 = parse_state::top_tags(this_00,str1,str2), !bVar3)) ||
     ((this_00->service_type)._M_string_length != 0)) {
    if ((((this_00->control_url)._M_string_length == 0) && (this_00->in_service == true)) &&
       ((str1_00._M_str = "service", str1_00._M_len = 7, str2_00._M_str = "controlurl",
        str2_00._M_len = 10, bVar3 = parse_state::top_tags(this_00,str1_00,str2_00), bVar3 &&
        (local_18._M_len != 0)))) {
      pcVar4 = (char *)(this_00->control_url)._M_string_length;
      psVar5 = &this_00->control_url;
    }
    else if (((this_00->model)._M_string_length == 0) &&
            (str1_01._M_str = "device", str1_01._M_len = 6, str2_01._M_str = "modelname",
            str2_01._M_len = 9, bVar3 = parse_state::top_tags(this_00,str1_01,str2_01), bVar3)) {
      pcVar4 = (char *)(this_00->model)._M_string_length;
      psVar5 = &this_00->model;
    }
    else {
      s2_00._M_str = "urlbase";
      s2_00._M_len = 7;
      bVar3 = aux::string_equal_no_case
                        (*(string_view *)
                          ((this_00->tag_stack).
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1),s2_00);
      if (!bVar3) {
        return;
      }
      pcVar4 = (char *)(this_00->url_base)._M_string_length;
      psVar5 = &this_00->url_base;
    }
    ::std::__cxx11::string::replace((ulong)psVar5,0,pcVar4,(ulong)local_18._M_str);
    return;
  }
  s1._M_str = local_18._M_str;
  s1._M_len = local_18._M_len;
  s2_01._M_str = "urn:schemas-upnp-org:service:WANIPConnection:1";
  s2_01._M_len = 0x2e;
  bVar3 = aux::string_equal_no_case(s1,s2_01);
  if (((!bVar3) &&
      (s1_00._M_str = local_18._M_str, s1_00._M_len = local_18._M_len,
      s2_02._M_str = "urn:schemas-upnp-org:service:WANIPConnection:2", s2_02._M_len = 0x2e,
      bVar3 = aux::string_equal_no_case(s1_00,s2_02), !bVar3)) &&
     (s1_01._M_str = local_18._M_str, s1_01._M_len = local_18._M_len,
     s2_03._M_str = "urn:schemas-upnp-org:service:WANPPPConnection:1", s2_03._M_len = 0x2f,
     bVar3 = aux::string_equal_no_case(s1_01,s2_03), !bVar3)) {
    return;
  }
  ::std::__cxx11::string::replace
            ((ulong)&this_00->service_type,0,(char *)(this_00->service_type)._M_string_length,
             (ulong)local_18._M_str);
  this_00->in_service = true;
  return;
}

Assistant:

void find_control_url(int const type, string_view str, parse_state& state)
{
	if (type == xml_start_tag)
	{
		state.tag_stack.push_back(str);
	}
	else if (type == xml_end_tag)
	{
		if (!state.tag_stack.empty())
		{
			if (state.in_service && string_equal_no_case(state.tag_stack.back(), "service"))
				state.in_service = false;
			state.tag_stack.pop_back();
		}
	}
	else if (type == xml_string)
	{
		if (state.tag_stack.empty()) return;
		// default to the first (or only) control url in the router's listing
		if (!state.in_service
			&& state.top_tags("service", "servicetype")
			&& state.service_type.empty())
		{
			if (string_equal_no_case(str, "urn:schemas-upnp-org:service:WANIPConnection:1")
				|| string_equal_no_case(str, "urn:schemas-upnp-org:service:WANIPConnection:2")
				|| string_equal_no_case(str, "urn:schemas-upnp-org:service:WANPPPConnection:1"))
			{
				state.service_type.assign(str.begin(), str.end());
				state.in_service = true;
			}
		}
		else if (state.control_url.empty() && state.in_service
			&& state.top_tags("service", "controlurl") && str.size() > 0)
		{
			// default to the first (or only) control url in the router's listing
			state.control_url.assign(str.begin(), str.end());
		}
		else if (state.model.empty() && state.top_tags("device", "modelname"))
		{
			state.model.assign(str.begin(), str.end());
		}
		else if (string_equal_no_case(state.tag_stack.back(), "urlbase"))
		{
			state.url_base.assign(str.begin(), str.end());
		}
	}
}